

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

ssize_t __thiscall
wasm::WasmBinaryWriter::write(WasmBinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t extraout_RAX;
  
  BufferWithRandomAccess::operator<<(this->o,0x6d736100);
  BufferWithRandomAccess::operator<<(this->o,1);
  writeDylinkSection(this);
  (this->lastDebugLocation).fileIndex = 0;
  (this->lastDebugLocation).lineNumber = 1;
  (this->lastDebugLocation).columnNumber = 0;
  (this->lastDebugLocation).symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
  if (this->sourceMap != (ostream *)0x0) {
    writeSourceMapProlog(this);
  }
  writeTypes(this);
  writeImports(this);
  writeFunctionSignatures(this);
  writeTableDeclarations(this);
  writeMemories(this);
  writeTags(this);
  if (((this->wasm->features).features & 0x4000) != 0) {
    writeStrings(this);
  }
  writeGlobals(this);
  writeExports(this);
  writeStart(this);
  writeElementSegments(this);
  writeDataCount(this);
  writeFunctions(this);
  writeDataSegments(this);
  if ((this->debugInfo != false) || (this->emitModuleName == true)) {
    writeNames(this);
  }
  if ((this->sourceMap != (ostream *)0x0) && ((this->sourceMapUrl)._M_string_length != 0)) {
    writeSourceMapUrl(this);
  }
  if ((this->symbolMap)._M_string_length != 0) {
    writeSymbolMap(this);
  }
  if (this->sourceMap != (ostream *)0x0) {
    writeSourceMapEpilog(this);
  }
  bVar1 = Debug::hasDWARFSections(this->wasm);
  if (bVar1) {
    Debug::writeDWARFSections(this->wasm,&this->binaryLocations);
  }
  writeLateCustomSections(this);
  writeFeaturesSection(this);
  return extraout_RAX;
}

Assistant:

void WasmBinaryWriter::write() {
  writeHeader();

  writeDylinkSection();

  initializeDebugInfo();
  if (sourceMap) {
    writeSourceMapProlog();
  }

  writeTypes();
  writeImports();
  writeFunctionSignatures();
  writeTableDeclarations();
  writeMemories();
  writeTags();
  if (wasm->features.hasStrings()) {
    writeStrings();
  }
  writeGlobals();
  writeExports();
  writeStart();
  writeElementSegments();
  writeDataCount();
  writeFunctions();
  writeDataSegments();
  if (debugInfo || emitModuleName) {
    writeNames();
  }
  if (sourceMap && !sourceMapUrl.empty()) {
    writeSourceMapUrl();
  }
  if (symbolMap.size() > 0) {
    writeSymbolMap();
  }

  if (sourceMap) {
    writeSourceMapEpilog();
  }

#ifdef BUILD_LLVM_DWARF
  // Update DWARF user sections after writing the data they refer to
  // (function bodies), and before writing the user sections themselves.
  if (Debug::hasDWARFSections(*wasm)) {
    Debug::writeDWARFSections(*wasm, binaryLocations);
  }
#endif

  writeLateCustomSections();
  writeFeaturesSection();
}